

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

int rs_read_thing(FILE *inf,MonsterThing *t)

{
  ItemThing *pIVar1;
  bool local_33;
  bool local_32;
  bool local_31;
  ItemThing *obj;
  int index;
  int listid;
  MonsterThing *t_local;
  FILE *inf_local;
  
  obj._4_4_ = 0;
  obj._0_4_ = -1;
  if ((read_error == 0) && (format_error == 0)) {
    _index = t;
    t_local = (MonsterThing *)inf;
    rs_read_marker(inf,-0x5432fffe);
    rs_read_int((FILE *)t_local,(int *)&obj);
    if ((int)obj == 0) {
      local_32 = format_error != 0 || read_error != 0;
      inf_local._4_4_ = (uint)local_32;
    }
    else {
      rs_read_coord((FILE *)t_local,&_index->pos);
      rs_read_int((FILE *)t_local,&_index->turn_delay);
      rs_read_char((FILE *)t_local,&_index->type);
      rs_read_char((FILE *)t_local,&_index->disguise);
      rs_read_int((FILE *)t_local,(int *)((long)&obj + 4));
      rs_read_int((FILE *)t_local,(int *)&obj);
      _index->reserved = -1;
      if (obj._4_4_ == 0) {
        if ((int)obj == 1) {
          _index->dest = &player.pos;
        }
        else {
          _index->dest = (coord *)0x0;
        }
      }
      else if (obj._4_4_ == 1) {
        _index->dest = (coord *)0x0;
        _index->reserved = (int)obj;
      }
      else if (obj._4_4_ == 2) {
        pIVar1 = get_list_item(&lvl_obj_abi_cxx11_,(int)obj);
        if (pIVar1 != (ItemThing *)0x0) {
          _index->dest = &pIVar1->pos;
        }
      }
      else {
        _index->dest = (coord *)0x0;
      }
      rs_read_int((FILE *)t_local,&_index->flags);
      rs_read_stats((FILE *)t_local,&_index->stats);
      rs_read_object_list((FILE *)t_local,&_index->pack);
      local_33 = format_error != 0 || read_error != 0;
      inf_local._4_4_ = (uint)local_33;
    }
  }
  else {
    local_31 = format_error != 0 || read_error != 0;
    inf_local._4_4_ = (uint)local_31;
  }
  return inf_local._4_4_;
}

Assistant:

static int rs_read_thing(FILE *inf, MonsterThing *t)
{
    int listid = 0, index = -1;

    if (read_error || format_error)
        return(READSTAT);

    rs_read_marker(inf, RSID_THING);

    rs_read_int(inf, &index);

    if (index == 0)
        return(READSTAT);

    rs_read_coord(inf,&t->pos);
    rs_read_int(inf,&t->turn_delay);
    rs_read_char(inf,&t->type);
    rs_read_char(inf,&t->disguise);
            
    /* 
        t_dest can be (listid,index):
        0,0: nullptr
        0,1: location of hero
        1,i: location of a thing (monster)
        2,i: location of an object
        3,i: location of gold in a room

        We need to remember what we are chasing rather than 
        the current location of what we are chasing.
    */
            
    rs_read_int(inf, &listid);
    rs_read_int(inf, &index);
    t->reserved = -1;

    if (listid == 0) /* hero or nullptr */
    {
        if (index == 1)
            t->dest = &hero;
        else
            t->dest = nullptr;
    }
    else if (listid == 1) /* monster/thing */
    {
        t->dest     = nullptr;
        t->reserved = index;
    }
    else if (listid == 2) /* object */
    {
        ItemThing *obj;

        obj = get_list_item(lvl_obj, index);

        if (obj != nullptr)
        {
            t->dest = &obj->pos;
        }
    }
    else
        t->dest = nullptr;
            
    rs_read_int(inf,&t->flags);
    rs_read_stats(inf,&t->stats);
    rs_read_object_list(inf, t->pack);
    
    return(READSTAT);
}